

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O3

void TasGrid::getGaussNodesAndWeights<true>
               (int n,vector<double,_std::allocator<double>_> *ref_points,
               vector<double,_std::allocator<double>_> *ref_weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *points_cache,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *weights_cache)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  void *pvVar4;
  pointer pdVar5;
  long lVar6;
  double *pdVar7;
  pointer pvVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  const_iterator __begin2;
  double *pdVar14;
  pointer pdVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  size_type __n;
  long lVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  vector<double,_std::allocator<double>_> dummy_diag;
  vector<double,_std::allocator<double>_> diag;
  vector<double,_std::allocator<double>_> offdiag;
  vector<double,_std::allocator<double>_> dummy_offdiag;
  vector<double,_std::allocator<double>_> local_108;
  allocator_type local_e9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  void *local_58 [2];
  long local_48;
  double local_40;
  ulong local_38;
  
  if (gauss_quadrature_version == '\0') {
    gauss_quadrature_version = '\x01';
  }
  pdVar2 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar19 = (long)pdVar3 - (long)pdVar2;
  pdVar14 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar17 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_e8 = points_cache;
  local_e0 = weights_cache;
  local_a0 = ref_weights;
  if (lVar19 != (long)pdVar17 - (long)pdVar14) {
    __assert_fail("ref_points.size() == ref_weights.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9e,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  if (pdVar3 == pdVar2) {
    __assert_fail("ref_points.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9f,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  local_40 = 0.0;
  for (; pdVar14 != pdVar17; pdVar14 = pdVar14 + 1) {
    local_40 = local_40 + *pdVar14;
  }
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,lVar19 >> 3,(value_type_conflict1 *)&local_98,(allocator_type *)&local_d8);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,
             (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict1 *)&local_d8,
             (allocator_type *)&local_b8);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_e8,(long)n);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_e0,(long)n);
  if (0 < n) {
    uVar25 = 0;
    local_38 = (ulong)(uint)n;
    do {
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_108);
      }
      else {
        *local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (uVar25 != 0) {
        dVar26 = NAN;
        lVar19 = (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        if (lVar19 != 0) {
          lVar19 = lVar19 >> 3;
          dVar26 = 0.0;
          dVar27 = 0.0;
          lVar20 = 0;
          do {
            dVar1 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20];
            dVar26 = dVar26 + dVar1 * local_98.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar20] *
                                      local_98.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar20];
            dVar27 = dVar27 + dVar1 * local_78.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar20] *
                                      local_78.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar19 + (ulong)(lVar19 == 0) != lVar20);
          dVar26 = dVar26 / dVar27;
        }
        if (dVar26 < 0.0) {
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)sqrt(dVar26);
        }
        else {
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)SQRT(dVar26);
        }
        if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_108);
        }
        else {
          *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (gauss_quadrature_version == '\0') {
        TasGrid::TasmanianTridiagonalSolver::getSymmetricEigenvalues
                  ((int)&local_108,(vector *)(ulong)((int)uVar25 + 1),(vector *)&local_d8);
        pvVar8 = (local_e8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = *(pointer *)
                  ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 0x10);
        pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data + 8) =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data + 0x10) =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((pvVar4 != (void *)0x0) &&
           (operator_delete(pvVar4,(long)pdVar2 - (long)pvVar4),
           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar8 = (local_e8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar19 = *(long *)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar16 = (long)*(pointer *)
                        ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar19;
        __n = (long)uVar16 >> 3;
        if ((uVar16 & 8) != 0) {
          *(undefined8 *)(lVar19 + -4 + __n * 4) = 0;
        }
        local_58[0] = (void *)0x0;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_108,__n,(value_type_conflict1 *)local_58,&local_e9);
        pvVar8 = (local_e0->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = *(pointer *)
                  ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 0x10);
        pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data + 8) =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data + 0x10) =
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((pvVar4 != (void *)0x0) &&
           (operator_delete(pvVar4,(long)pdVar2 - (long)pvVar4),
           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar8 = (local_e8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar19 = *(long *)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar20 = (long)*(pointer *)
                        ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar19;
        if (lVar20 != 0) {
          uVar16 = lVar20 >> 3;
          pdVar2 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar20 = (long)pdVar3 - (long)pdVar2 >> 3;
          pdVar5 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar8 = (local_e0->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar22 = 0;
          do {
            if (pdVar3 != pdVar2) {
              lVar6 = *(long *)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data;
              lVar18 = 0;
              do {
                dVar26 = 1.0;
                if (lVar22 != 0) {
                  lVar23 = 0;
                  dVar26 = 1.0;
                  do {
                    dVar27 = *(double *)(lVar19 + lVar23 * 8);
                    dVar26 = dVar26 * ((pdVar2[lVar18] - dVar27) /
                                      (*(double *)(lVar19 + lVar22 * 8) - dVar27));
                    lVar23 = lVar23 + 1;
                  } while (lVar22 != lVar23);
                }
                if (lVar22 + 1U < uVar16) {
                  uVar24 = lVar22 + 1U;
                  do {
                    dVar27 = *(double *)(lVar19 + uVar24 * 8);
                    dVar26 = dVar26 * ((pdVar2[lVar18] - dVar27) /
                                      (*(double *)(lVar19 + lVar22 * 8) - dVar27));
                    uVar24 = uVar24 + 1;
                  } while (uVar16 != uVar24);
                }
                *(double *)(lVar6 + lVar22 * 8) =
                     dVar26 * pdVar5[lVar18] + *(double *)(lVar6 + lVar22 * 8);
                lVar18 = lVar18 + 1;
              } while (lVar18 != lVar20 + (ulong)(lVar20 == 0));
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != uVar16 + (uVar16 == 0));
        }
      }
      else {
        std::vector<double,_std::allocator<double>_>::vector(&local_108,&local_d8);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_58,&local_b8);
        TasGrid::TasmanianTridiagonalSolver::decompose
                  ((vector *)&local_108,(vector *)local_58,local_40,
                   (vector *)
                   ((local_e8->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar25),
                   (vector *)
                   ((local_e0->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar25));
        if (local_58[0] != (void *)0x0) {
          operator_delete(local_58[0],local_48 - (long)local_58[0]);
        }
        if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      pdVar12 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      pdVar5 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar15 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar14 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar11 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar13;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar12;
      pdVar17 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar17 != pdVar7) {
        pvVar8 = (local_e8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = *(pointer *)
                   ((long)&pvVar8[uVar25].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8);
        do {
          dVar26 = 1.0;
          if (pdVar9 != pdVar10) {
            dVar26 = 1.0;
            pdVar21 = pdVar9;
            do {
              dVar26 = dVar26 * (*pdVar17 - *pdVar21);
              pdVar21 = pdVar21 + 1;
            } while (pdVar21 != pdVar10);
          }
          *pdVar15 = dVar26;
          pdVar17 = pdVar17 + 1;
          pdVar15 = pdVar15 + 1;
        } while (pdVar17 != pdVar7);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_38);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void getGaussNodesAndWeights(const int n, const std::vector<double> &ref_points, const std::vector<double> &ref_weights,
                                    std::vector<std::vector<double>> &points_cache, std::vector<std::vector<double>> &weights_cache) {
    #ifndef Tasmanian_ENABLE_BLAS
    // If BLAS is not enabled, we must use an implementation that does not require it.
    if (gauss_quadrature_version == 1) {
        gauss_quadrature_version = 2;
    }
    #endif
    // Compute the roots incrementally.
    assert(ref_points.size() == ref_weights.size());
    assert(ref_points.size() > 0);
    double mu0 = 0.0;
    for (auto &w : ref_weights) mu0 += w;
    std::vector<double> poly_m1_vals(ref_points.size(), 0.0), poly_vals(ref_points.size(), 1.0);
    std::vector<double> diag, offdiag;
    points_cache.resize(n);
    weights_cache.resize(n);
    for (int i=0; i<n; i++) {
        // Form the diagonal and offdiagonal vectors of the Jacobi matrix.
        if (is_symmetric) {
            diag.push_back(0.0);
        } else {
            double diag_numr = 0.0;
            double diag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
            diag_numr += ref_points[j] * (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            diag_denm += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            }
            diag.push_back(diag_numr / diag_denm);
        }
        if (i >= 1) {
            double sqr_offdiag_numr = 0.0;
            double sqr_offdiag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
                sqr_offdiag_numr += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
                sqr_offdiag_denm += (poly_m1_vals[j] * poly_m1_vals[j])  * ref_weights[j];
            }
            offdiag.push_back(std::sqrt(sqr_offdiag_numr / sqr_offdiag_denm));
        }
        // Compute the Gauss points and weights.
        if (gauss_quadrature_version == 1) {
            // Use LAPACK to obtain the Gauss points, and use the reference points and weights to obtain the Gauss weights.
            // Note that the matrix is always symmetric even if the weights function is not.
            points_cache[i] = TasmanianTridiagonalSolver::getSymmetricEigenvalues(i+1, diag, offdiag);
            if (points_cache[i].size() % 2 == 1 && is_symmetric) {
                points_cache[i][(points_cache[i].size() - 1) / 2] = 0.0;
            }
            weights_cache[i] = std::vector<double>(points_cache[i].size(), 0.0);
            for (size_t j=0; j<points_cache[i].size(); j++) {
                // Integrate the function l_j(x) according to the measure induced by the function [weight_fn(x) + shift].
                for (size_t k=0; k<ref_points.size(); k++) {
                    weights_cache[i][j] += lagrange_eval(j, points_cache[i], ref_points[k]) * ref_weights[k];
                }
            }
        } else if (gauss_quadrature_version == 2) {
            // Use TasmanianTridiagonalSolver::decompose().
            std::vector<double> dummy_diag = diag;
            std::vector<double> dummy_offdiag = offdiag;
            TasmanianTridiagonalSolver::decompose(dummy_diag, dummy_offdiag, mu0, points_cache[i], weights_cache[i]);
        } else {
            throw std::invalid_argument("ERROR: gauss_quadrature_version must be a valid number!");
        }
        // Update the values of the polynomials at ref_points.
        std::swap(poly_m1_vals, poly_vals);
        std::transform(ref_points.begin(), ref_points.end(), poly_vals.begin(),
                       [&points_cache, i](double x){return poly_eval(points_cache[i], x);});
    }
}